

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# floor1.c
# Opt level: O0

void floor1_pack(vorbis_info_floor *i,oggpack_buffer *opb)

{
  int iVar1;
  int iVar2;
  int local_38;
  int maxclass;
  int maxposit;
  int rangebits;
  int count;
  int k;
  int j;
  vorbis_info_floor1 *info;
  oggpack_buffer *opb_local;
  vorbis_info_floor *i_local;
  
  maxposit = 0;
  iVar2 = *(int *)((long)i + 0x348);
  local_38 = -1;
  oggpack_write(opb,(long)*i,5);
  for (count = 0; count < *i; count = count + 1) {
    oggpack_write(opb,(long)*(int *)((long)i + (long)count * 4 + 4),4);
    if (local_38 < *(int *)((long)i + (long)count * 4 + 4)) {
      local_38 = *(int *)((long)i + (long)count * 4 + 4);
    }
  }
  for (count = 0; count < local_38 + 1; count = count + 1) {
    oggpack_write(opb,(long)(*(int *)((long)i + (long)count * 4 + 0x80) + -1),3);
    oggpack_write(opb,(long)*(int *)((long)i + (long)count * 4 + 0xc0),2);
    if (*(int *)((long)i + (long)count * 4 + 0xc0) != 0) {
      oggpack_write(opb,(long)*(int *)((long)i + (long)count * 4 + 0x100),8);
    }
    for (rangebits = 0;
        rangebits < 1 << ((byte)*(undefined4 *)((long)i + (long)count * 4 + 0xc0) & 0x1f);
        rangebits = rangebits + 1) {
      oggpack_write(opb,(long)(*(int *)((long)i + (long)rangebits * 4 + (long)count * 0x20 + 0x140)
                              + 1),8);
    }
  }
  oggpack_write(opb,(long)(*(int *)((long)i + 0x340) + -1),2);
  iVar1 = ov_ilog(iVar2 - 1);
  oggpack_write(opb,(long)iVar1,4);
  iVar2 = ov_ilog(iVar2 - 1);
  rangebits = 0;
  for (count = 0; count < *i; count = count + 1) {
    maxposit = *(int *)((long)i + (long)*(int *)((long)i + (long)count * 4 + 4) * 4 + 0x80) +
               maxposit;
    for (; rangebits < maxposit; rangebits = rangebits + 1) {
      oggpack_write(opb,(long)*(int *)((long)i + (long)(rangebits + 2) * 4 + 0x344),iVar2);
    }
  }
  return;
}

Assistant:

static void floor1_pack (vorbis_info_floor *i,oggpack_buffer *opb){
  vorbis_info_floor1 *info=(vorbis_info_floor1 *)i;
  int j,k;
  int count=0;
  int rangebits;
  int maxposit=info->postlist[1];
  int maxclass=-1;

  /* save out partitions */
  oggpack_write(opb,info->partitions,5); /* only 0 to 31 legal */
  for(j=0;j<info->partitions;j++){
    oggpack_write(opb,info->partitionclass[j],4); /* only 0 to 15 legal */
    if(maxclass<info->partitionclass[j])maxclass=info->partitionclass[j];
  }

  /* save out partition classes */
  for(j=0;j<maxclass+1;j++){
    oggpack_write(opb,info->class_dim[j]-1,3); /* 1 to 8 */
    oggpack_write(opb,info->class_subs[j],2); /* 0 to 3 */
    if(info->class_subs[j])oggpack_write(opb,info->class_book[j],8);
    for(k=0;k<(1<<info->class_subs[j]);k++)
      oggpack_write(opb,info->class_subbook[j][k]+1,8);
  }

  /* save out the post list */
  oggpack_write(opb,info->mult-1,2);     /* only 1,2,3,4 legal now */
  /* maxposit cannot legally be less than 1; this is encode-side, we
     can assume our setup is OK */
  oggpack_write(opb,ov_ilog(maxposit-1),4);
  rangebits=ov_ilog(maxposit-1);

  for(j=0,k=0;j<info->partitions;j++){
    count+=info->class_dim[info->partitionclass[j]];
    for(;k<count;k++)
      oggpack_write(opb,info->postlist[k+2],rangebits);
  }
}